

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_functor::binary_op_rsub>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  int local_ac;
  float *local_98;
  float *local_88;
  __m128 _outp;
  __m128 _p;
  __m128 _b;
  int i;
  int size;
  binary_op_rsub op;
  int elempack_local;
  int w_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  
  local_ac = 0;
  fVar1 = *ptr1;
  local_98 = outptr;
  local_88 = ptr;
  for (; local_ac + 3 < w * elempack; local_ac = local_ac + 4) {
    ptr1_local._0_4_ = (float)*(undefined8 *)local_88;
    ptr1_local._4_4_ = (float)((ulong)*(undefined8 *)local_88 >> 0x20);
    ptr_local._0_4_ = (float)*(undefined8 *)(local_88 + 2);
    ptr_local._4_4_ = (float)((ulong)*(undefined8 *)(local_88 + 2) >> 0x20);
    *(ulong *)local_98 = CONCAT44(fVar1 - ptr1_local._4_4_,fVar1 - ptr1_local._0_4_);
    *(ulong *)(local_98 + 2) = CONCAT44(fVar1 - ptr_local._4_4_,fVar1 - ptr_local._0_4_);
    local_88 = local_88 + 4;
    local_98 = local_98 + 4;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}